

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_avx2.c
# Opt level: O0

void lowbd_blend_a64_d16_mask_subw1_subh1_w32_avx2
               (uint8_t *dst,uint32_t dst_stride,CONV_BUF_TYPE *src0,uint32_t src0_stride,
               CONV_BUF_TYPE *src1,uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int h,
               int w,__m256i *round_offset,int shift)

{
  undefined1 auVar1 [32];
  uint in_ECX;
  long in_RDX;
  void *in_RSI;
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar8 [16];
  undefined1 auVar7 [64];
  long in_stack_00000008;
  __m256i m0;
  __m256i m1_acbd;
  __m256i m0_acbd;
  __m256i m1_ac;
  __m256i m0_ac;
  __m256i m_i11;
  __m256i m_i10;
  __m256i m_i01;
  __m256i m_i00;
  int j;
  int i;
  __m256i two_w;
  __m256i one_b;
  __m256i v_maxval;
  undefined4 in_stack_fffffffffffffaec;
  int in_stack_fffffffffffffaf0;
  undefined4 local_3a8;
  undefined4 local_3a4;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined8 local_320;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  
  auVar8 = vpinsrw_avx(ZEXT216(0x40),0x40,1);
  auVar8 = vpinsrw_avx(auVar8,0x40,2);
  auVar8 = vpinsrw_avx(auVar8,0x40,3);
  auVar8 = vpinsrw_avx(auVar8,0x40,4);
  auVar8 = vpinsrw_avx(auVar8,0x40,5);
  auVar8 = vpinsrw_avx(auVar8,0x40,6);
  auVar8 = vpinsrw_avx(auVar8,0x40,7);
  auVar2 = vpinsrw_avx(ZEXT216(0x40),0x40,1);
  auVar2 = vpinsrw_avx(auVar2,0x40,2);
  auVar2 = vpinsrw_avx(auVar2,0x40,3);
  auVar2 = vpinsrw_avx(auVar2,0x40,4);
  auVar2 = vpinsrw_avx(auVar2,0x40,5);
  auVar2 = vpinsrw_avx(auVar2,0x40,6);
  auVar2 = vpinsrw_avx(auVar2,0x40,7);
  local_c0 = auVar8._0_8_;
  uStack_b8 = auVar8._8_8_;
  uStack_b0 = auVar2._0_8_;
  auVar8 = vpinsrb_avx(ZEXT116(1),1,1);
  auVar8 = vpinsrb_avx(auVar8,1,2);
  auVar8 = vpinsrb_avx(auVar8,1,3);
  auVar8 = vpinsrb_avx(auVar8,1,4);
  auVar8 = vpinsrb_avx(auVar8,1,5);
  auVar8 = vpinsrb_avx(auVar8,1,6);
  auVar8 = vpinsrb_avx(auVar8,1,7);
  auVar8 = vpinsrb_avx(auVar8,1,8);
  auVar8 = vpinsrb_avx(auVar8,1,9);
  auVar8 = vpinsrb_avx(auVar8,1,10);
  auVar8 = vpinsrb_avx(auVar8,1,0xb);
  auVar8 = vpinsrb_avx(auVar8,1,0xc);
  auVar8 = vpinsrb_avx(auVar8,1,0xd);
  auVar8 = vpinsrb_avx(auVar8,1,0xe);
  auVar8 = vpinsrb_avx(auVar8,1,0xf);
  auVar2 = vpinsrb_avx(ZEXT116(1),1,1);
  auVar2 = vpinsrb_avx(auVar2,1,2);
  auVar2 = vpinsrb_avx(auVar2,1,3);
  auVar2 = vpinsrb_avx(auVar2,1,4);
  auVar2 = vpinsrb_avx(auVar2,1,5);
  auVar2 = vpinsrb_avx(auVar2,1,6);
  auVar2 = vpinsrb_avx(auVar2,1,7);
  auVar2 = vpinsrb_avx(auVar2,1,8);
  auVar2 = vpinsrb_avx(auVar2,1,9);
  auVar2 = vpinsrb_avx(auVar2,1,10);
  auVar2 = vpinsrb_avx(auVar2,1,0xb);
  auVar2 = vpinsrb_avx(auVar2,1,0xc);
  auVar2 = vpinsrb_avx(auVar2,1,0xd);
  auVar2 = vpinsrb_avx(auVar2,1,0xe);
  auVar2 = vpinsrb_avx(auVar2,1,0xf);
  local_100 = auVar8._0_8_;
  uStack_f8 = auVar8._8_8_;
  uStack_f0 = auVar2._0_8_;
  uStack_e8 = auVar2._8_8_;
  auVar8 = vpinsrw_avx(ZEXT216(2),2,1);
  auVar8 = vpinsrw_avx(auVar8,2,2);
  auVar8 = vpinsrw_avx(auVar8,2,3);
  auVar8 = vpinsrw_avx(auVar8,2,4);
  auVar8 = vpinsrw_avx(auVar8,2,5);
  auVar8 = vpinsrw_avx(auVar8,2,6);
  auVar8 = vpinsrw_avx(auVar8,2,7);
  auVar2 = vpinsrw_avx(ZEXT216(2),2,1);
  auVar2 = vpinsrw_avx(auVar2,2,2);
  auVar2 = vpinsrw_avx(auVar2,2,3);
  auVar2 = vpinsrw_avx(auVar2,2,4);
  auVar2 = vpinsrw_avx(auVar2,2,5);
  auVar2 = vpinsrw_avx(auVar2,2,6);
  auVar2 = vpinsrw_avx(auVar2,2,7);
  auVar2 = ZEXT116(0) * auVar8 + ZEXT116(1) * auVar2;
  auVar8 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar8;
  auVar7 = ZEXT3264(CONCAT1616(auVar8,auVar2));
  local_320 = in_RDX;
  for (local_3a4 = 0; local_3a4 < (int)mask_stride; local_3a4 = local_3a4 + 1) {
    for (local_3a8 = 0; auVar3 = auVar7._0_32_, local_3a8 < h; local_3a8 = local_3a8 + 0x20) {
      yy_loadu_256((__m256i *)(in_stack_00000008 + (local_3a8 << 1)),in_RSI);
      auVar4 = auVar3;
      yy_loadu_256((__m256i *)(in_stack_00000008 + (local_3a8 << 1) + 0x20),in_RSI);
      auVar5 = auVar4;
      yy_loadu_256((__m256i *)
                   (in_stack_00000008 + ((ulong)mask & 0xffffffff) + (long)(local_3a8 << 1)),in_RSI)
      ;
      auVar6 = auVar5;
      yy_loadu_256((__m256i *)
                   (in_stack_00000008 + ((ulong)mask & 0xffffffff) + (long)(local_3a8 << 1) + 0x20),
                   in_RSI);
      auVar3 = vpaddusb_avx2(auVar3,auVar5);
      auVar6 = vpaddusb_avx2(auVar4,auVar6);
      auVar4._8_8_ = uStack_f8;
      auVar4._0_8_ = local_100;
      auVar4._16_8_ = uStack_f0;
      auVar4._24_8_ = uStack_e8;
      auVar3 = vpmaddubsw_avx2(auVar3,auVar4);
      auVar5._8_8_ = uStack_f8;
      auVar5._0_8_ = local_100;
      auVar5._16_8_ = uStack_f0;
      auVar5._24_8_ = uStack_e8;
      auVar6 = vpmaddubsw_avx2(auVar6,auVar5);
      uStack_390 = auVar8._0_8_;
      uStack_388 = auVar8._8_8_;
      auVar1._16_8_ = uStack_390;
      auVar1._0_16_ = auVar2;
      auVar1._24_8_ = uStack_388;
      auVar3 = vpaddw_avx2(auVar3,auVar1);
      vpsrlw_avx2(auVar3,ZEXT416(2));
      auVar3._16_8_ = uStack_390;
      auVar3._0_16_ = auVar2;
      auVar3._24_8_ = uStack_388;
      auVar3 = vpaddw_avx2(auVar6,auVar3);
      auVar3 = vpsrlw_avx2(auVar3,ZEXT416(2));
      in_RSI = (void *)(local_320 + (long)local_3a8 * 2);
      auVar7 = ZEXT1664(auVar3._0_16_);
      blend_a64_d16_mask_w32_avx2
                (uStack_b0,uStack_b8,local_c0,uStack_e8,uStack_f0,uStack_f8,
                 (__m256i *)CONCAT44(in_stack_fffffffffffffaec,round_offset._0_4_),
                 in_stack_fffffffffffffaf0);
    }
    in_stack_00000008 = in_stack_00000008 + (ulong)(uint)((int)mask << 1);
    local_320 = local_320 + (ulong)in_ECX * 2;
  }
  return;
}

Assistant:

static inline void lowbd_blend_a64_d16_mask_subw1_subh1_w32_avx2(
    uint8_t *dst, uint32_t dst_stride, const CONV_BUF_TYPE *src0,
    uint32_t src0_stride, const CONV_BUF_TYPE *src1, uint32_t src1_stride,
    const uint8_t *mask, uint32_t mask_stride, int h, int w,
    const __m256i *round_offset, int shift) {
  const __m256i v_maxval = _mm256_set1_epi16(AOM_BLEND_A64_MAX_ALPHA);
  const __m256i one_b = _mm256_set1_epi8(1);
  const __m256i two_w = _mm256_set1_epi16(2);
  for (int i = 0; i < h; ++i) {
    for (int j = 0; j < w; j += 32) {
      const __m256i m_i00 = yy_loadu_256(mask + 2 * j);
      const __m256i m_i01 = yy_loadu_256(mask + 2 * j + 32);
      const __m256i m_i10 = yy_loadu_256(mask + mask_stride + 2 * j);
      const __m256i m_i11 = yy_loadu_256(mask + mask_stride + 2 * j + 32);

      const __m256i m0_ac = _mm256_adds_epu8(m_i00, m_i10);
      const __m256i m1_ac = _mm256_adds_epu8(m_i01, m_i11);
      const __m256i m0_acbd = _mm256_maddubs_epi16(m0_ac, one_b);
      const __m256i m1_acbd = _mm256_maddubs_epi16(m1_ac, one_b);
      const __m256i m0 = _mm256_srli_epi16(_mm256_add_epi16(m0_acbd, two_w), 2);
      const __m256i m1 = _mm256_srli_epi16(_mm256_add_epi16(m1_acbd, two_w), 2);

      blend_a64_d16_mask_w32_avx2(dst + j, src0 + j, src1 + j, &m0, &m1,
                                  round_offset, &v_maxval, shift);
    }
    mask += mask_stride << 1;
    dst += dst_stride;
    src0 += src0_stride;
    src1 += src1_stride;
  }
}